

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::Loop::GetInductionStepOperation(Loop *this,Instruction *induction)

{
  IRContext *pIVar1;
  CFG *this_00;
  DefUseManager *this_01;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t id;
  BasicBlock *pBVar5;
  const_iterator cVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint32_t local_3c;
  DefUseManager *local_38;
  
  if (induction->opcode_ != OpPhi) {
    __assert_fail("induction->opcode() == spv::Op::OpPhi",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x27,
                  "Instruction *spvtools::opt::Loop::GetInductionStepOperation(const Instruction *) const"
                 );
  }
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  bVar2 = induction->has_type_id_;
  bVar9 = induction->has_result_id_;
  uVar11 = (bVar9 & 1) + 1;
  if ((bool)bVar2 == false) {
    uVar11 = (uint)bVar9;
  }
  if (1 < (int)((ulong)((long)(induction->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(induction->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar11
     ) {
    local_38 = (pIVar1->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar11 = 1;
    do {
      pIVar1 = this->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
        bVar2 = induction->has_type_id_;
        bVar9 = induction->has_result_id_;
      }
      this_00 = (pIVar1->cfg_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
                _M_t.
                super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
      uVar10 = (bVar9 & 1) + 1;
      if ((bVar2 & 1) == 0) {
        uVar10 = (uint)bVar9;
      }
      uVar3 = Instruction::GetSingleWordOperand(induction,uVar10 + uVar11);
      pBVar5 = CFG::block(this_00,uVar3);
      pIVar7 = (pBVar5->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar3 = 0;
      if (pIVar7->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar7,(uint)pIVar7->has_type_id_);
      }
      local_3c = uVar3;
      cVar6 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->loop_basic_blocks_)._M_h,&local_3c);
      if (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        uVar10 = (induction->has_result_id_ & 1) + 1;
        if (induction->has_type_id_ == false) {
          uVar10 = (uint)induction->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(induction,(uVar10 + uVar11) - 1);
        pIVar7 = analysis::DefUseManager::GetDef(local_38,uVar3);
        if (pIVar7 == (Instruction *)0x0) {
          return (Instruction *)0x0;
        }
        uVar3 = 0;
        if ((pIVar7->opcode_ & ~OpSourceContinued) != OpIAdd) {
          return (Instruction *)0x0;
        }
        uVar4 = (pIVar7->has_result_id_ & 1) + 1;
        if (pIVar7->has_type_id_ == false) {
          uVar4 = (uint)pIVar7->has_result_id_;
        }
        uVar4 = Instruction::GetSingleWordOperand(pIVar7,uVar4);
        uVar11 = (pIVar7->has_result_id_ & 1) + 1;
        if (pIVar7->has_type_id_ == false) {
          uVar11 = (uint)pIVar7->has_result_id_;
        }
        id = Instruction::GetSingleWordOperand(pIVar7,uVar11 + 1);
        if (induction->has_result_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(induction,(uint)induction->has_type_id_);
        }
        if (uVar4 != uVar3) {
          uVar3 = 0;
          if (induction->has_result_id_ == true) {
            uVar3 = Instruction::GetSingleWordOperand(induction,(uint)induction->has_type_id_);
          }
          if (id != uVar3) {
            return (Instruction *)0x0;
          }
        }
        this_01 = local_38;
        pIVar8 = analysis::DefUseManager::GetDef(local_38,uVar4);
        if (pIVar8->opcode_ == OpConstant) {
          return pIVar7;
        }
        pIVar8 = analysis::DefUseManager::GetDef(this_01,id);
        if (pIVar8->opcode_ != OpConstant) {
          return (Instruction *)0x0;
        }
        return pIVar7;
      }
      uVar11 = uVar11 + 2;
      bVar2 = induction->has_type_id_;
      bVar9 = induction->has_result_id_;
      uVar10 = (bVar9 & 1) + 1;
      if ((bool)bVar2 == false) {
        uVar10 = (uint)bVar9;
      }
    } while (uVar11 < (int)((ulong)((long)(induction->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(induction->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar10);
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* Loop::GetInductionStepOperation(
    const Instruction* induction) const {
  // Induction must be a phi instruction.
  assert(induction->opcode() == spv::Op::OpPhi);

  Instruction* step = nullptr;

  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  // Traverse the incoming operands of the phi instruction.
  for (uint32_t operand_id = 1; operand_id < induction->NumInOperands();
       operand_id += 2) {
    // Incoming edge.
    BasicBlock* incoming_block =
        context_->cfg()->block(induction->GetSingleWordInOperand(operand_id));

    // Check if the block is dominated by header, and thus coming from within
    // the loop.
    if (IsInsideLoop(incoming_block)) {
      step = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id - 1));
      break;
    }
  }

  if (!step || !IsSupportedStepOp(step->opcode())) {
    return nullptr;
  }

  // The induction variable which binds the loop must only be modified once.
  uint32_t lhs = step->GetSingleWordInOperand(0);
  uint32_t rhs = step->GetSingleWordInOperand(1);

  // One of the left hand side or right hand side of the step instruction must
  // be the induction phi and the other must be an OpConstant.
  if (lhs != induction->result_id() && rhs != induction->result_id()) {
    return nullptr;
  }

  if (def_use_manager->GetDef(lhs)->opcode() != spv::Op::OpConstant &&
      def_use_manager->GetDef(rhs)->opcode() != spv::Op::OpConstant) {
    return nullptr;
  }

  return step;
}